

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

bool __thiscall AActor::IsOkayToAttack(AActor *this,AActor *link)

{
  uint uVar1;
  bool bVar2;
  _func_int **in_RAX;
  AActor *pAVar3;
  AActor *this_00;
  _func_int **local_28;
  
  if ((this->player == (player_t *)0x0) && (((this->flags5).Value & 0x2000000) == 0)) {
    if (link == this) {
      return false;
    }
    if (((this->flags2).Value & 0x40000000) == 0) {
      return false;
    }
  }
  else if (link == this) {
    return false;
  }
  if ((link->player == (player_t *)0x0) && (((link->flags3).Value & 0x2000) == 0)) {
    return false;
  }
  uVar1 = (link->flags).Value;
  if ((uVar1 & 4) == 0) {
    return false;
  }
  if (((link->flags2).Value & 0x10000000) != 0) {
    return false;
  }
  this_00 = this;
  if (this->player == (player_t *)0x0) {
    if (((this->flags5).Value & 0x2000000) == 0) {
      if (((this->flags2).Value & 0x40000000) == 0) {
        if ((((this->flags).Value & 0x8000000) != 0) && ((ulong)this->FriendPlayer != 0)) {
          this_00 = (AActor *)(&pr_dmspawn)[(ulong)this->FriendPlayer * 6].sfmt.u64[5];
          goto LAB_0042518b;
        }
      }
      else {
        this_00 = (this->target).field_0.p;
        if ((this_00 == (AActor *)0x0) ||
           (((this_00->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0)) goto LAB_0042518b;
        (this->target).field_0.p = (AActor *)0x0;
      }
    }
    else {
      this_00 = (this->tracer).field_0.p;
      if ((this_00 == (AActor *)0x0) ||
         (((this_00->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0)) goto LAB_0042518b;
      (this->tracer).field_0.p = (AActor *)0x0;
    }
    this_00 = (AActor *)0x0;
  }
LAB_0042518b:
  if ((this_00 != (AActor *)0x0 && this_00 != link) &&
     (local_28 = in_RAX, bVar2 = IsFriend(this_00,link), !bVar2)) {
    if (((link->flags5).Value & 0x2000000) != 0) {
      pAVar3 = (link->tracer).field_0.p;
      if ((pAVar3 != (AActor *)0x0) &&
         (((pAVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
        (link->tracer).field_0.p = (AActor *)0x0;
        pAVar3 = (AActor *)0x0;
      }
      if (pAVar3 == this_00) {
        return false;
      }
    }
    if (((((multiplayer != true) || (deathmatch.Value != 0)) || (link->player == (player_t *)0x0))
        || (this_00->player == (player_t *)0x0)) &&
       (((((uVar1 & (this->flags).Value) >> 0x1b & 1) == 0 || (bVar2 = IsFriend(this,link), !bVar2))
        && (bVar2 = P_CheckSight(this,link,0), bVar2)))) {
      if (((this->flags3).Value & 0x1000000) == 0) {
        return true;
      }
      AngleTo((AActor *)&stack0xffffffffffffffd8,this_00,SUB81(link,0));
      if (ABS((double)SUB84(((double)local_28 - (this_00->Angles).Yaw.Degrees) * 11930464.711111112
                            + 6755399441055744.0,0) * 8.381903171539307e-08) < 21.333333333333336) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool AActor::IsOkayToAttack (AActor *link)
{
	if (!(player							// Original AActor::IsOkayToAttack was only for players
	//	|| (flags  & MF_FRIENDLY)			// Maybe let friendly monsters use the function as well?
		|| (flags5 & MF5_SUMMONEDMONSTER)	// AMinotaurFriend has its own version, generalized to other summoned monsters
		|| (flags2 & MF2_SEEKERMISSILE)))	// AHolySpirit and AMageStaffFX2 as well, generalized to other seeker missiles
	{	// Normal monsters and other actors always return false.
		return false;
	}
	// Standard things to eliminate: an actor shouldn't attack itself,
	// or a non-shootable, dormant, non-player-and-non-monster actor.
	if (link == this)									return false;
	if (!(link->player||(link->flags3 & MF3_ISMONSTER)))return false;
	if (!(link->flags & MF_SHOOTABLE))					return false;
	if (link->flags2 & MF2_DORMANT)						return false;

	// An actor shouldn't attack friendly actors. The reference depends
	// on the type of actor: for a player's actor, itself; for a projectile,
	// its target; and for a summoned minion, its tracer.
	AActor * Friend = NULL;
	if (player)											Friend = this;
	else if (flags5 & MF5_SUMMONEDMONSTER)				Friend = tracer;
	else if (flags2 & MF2_SEEKERMISSILE)				Friend = target;
	else if ((flags & MF_FRIENDLY) && FriendPlayer)		Friend = players[FriendPlayer-1].mo;

	// Friend checks
	if (link == Friend)									return false;
	if (Friend == NULL)									return false;
	if (Friend->IsFriend(link))							return false;
	if ((link->flags5 & MF5_SUMMONEDMONSTER)			// No attack against minions on the same side
		&& (link->tracer == Friend))					return false;
	if (multiplayer && !deathmatch						// No attack against fellow players in coop
		&& link->player && Friend->player)				return false;
	if (((flags & link->flags) & MF_FRIENDLY)			// No friendly infighting amongst minions
		&& IsFriend(link))								return false;

	// Now that all the actor checks are made, the line of sight can be checked
	if (P_CheckSight (this, link))
	{
		// AMageStaffFX2::IsOkayToAttack had an extra check here, generalized with a flag,
		// to only allow the check to succeed if the enemy was in a ~84� FOV of the player
		if (flags3 & MF3_SCREENSEEKER)
		{
			DAngle angle = absangle(Friend->AngleTo(link), Friend->Angles.Yaw);
			if (angle < 30 * (256./360.))
			{
				return true;
			}
		}
		// Other actors are not concerned by this check
		else return true;
	}
	// The sight check was failed, or the angle wasn't right for a screenseeker
	return false;
}